

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL>::resize
          (ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL> *this,size_t newSize)

{
  ulong uVar1;
  
  if (this->numActive < newSize) {
    reserve(this,newSize);
    uVar1 = this->numActive;
    if (uVar1 <= newSize && newSize - uVar1 != 0) {
      memset(this->items + uVar1,0,(newSize - uVar1) * 8);
      this->numActive = newSize;
    }
    return;
  }
  shrink(this,newSize);
  return;
}

Assistant:

void resize (size_t newSize)
    {
        if (newSize > numActive)
        {
            reserve (newSize);

            while (numActive < newSize)
                new (items + numActive++) Item (Item());
        }
        else
        {
            shrink (newSize);
        }
    }